

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void yaml_event_delete(yaml_event_t *event)

{
  yaml_tag_directive_t *local_18;
  yaml_tag_directive_t *tag_directive;
  yaml_event_t *event_local;
  
  if (event != (yaml_event_t *)0x0) {
    switch(event->type) {
    case YAML_DOCUMENT_START_EVENT:
      yaml_free((event->data).document_start.version_directive);
      for (local_18 = (event->data).document_start.tag_directives.start;
          local_18 != (event->data).document_start.tag_directives.end; local_18 = local_18 + 1) {
        yaml_free(local_18->handle);
        yaml_free(local_18->prefix);
      }
      yaml_free((event->data).document_start.tag_directives.start);
      break;
    default:
      break;
    case YAML_ALIAS_EVENT:
      yaml_free((event->data).document_start.version_directive);
      break;
    case YAML_SCALAR_EVENT:
      yaml_free((event->data).document_start.version_directive);
      yaml_free((event->data).document_start.tag_directives.start);
      yaml_free((event->data).document_start.tag_directives.end);
      break;
    case YAML_SEQUENCE_START_EVENT:
      yaml_free((event->data).document_start.version_directive);
      yaml_free((event->data).document_start.tag_directives.start);
      break;
    case YAML_MAPPING_START_EVENT:
      yaml_free((event->data).document_start.version_directive);
      yaml_free((event->data).document_start.tag_directives.start);
    }
    memset(event,0,0x68);
    return;
  }
  __assert_fail("event",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x3dd,"void yaml_event_delete(yaml_event_t *)");
}

Assistant:

YAML_DECLARE(void)
yaml_event_delete(yaml_event_t *event)
{
    yaml_tag_directive_t *tag_directive;

    assert(event);  /* Non-NULL event object expected. */

    switch (event->type)
    {
        case YAML_DOCUMENT_START_EVENT:
            yaml_free(event->data.document_start.version_directive);
            for (tag_directive = event->data.document_start.tag_directives.start;
                    tag_directive != event->data.document_start.tag_directives.end;
                    tag_directive++) {
                yaml_free(tag_directive->handle);
                yaml_free(tag_directive->prefix);
            }
            yaml_free(event->data.document_start.tag_directives.start);
            break;

        case YAML_ALIAS_EVENT:
            yaml_free(event->data.alias.anchor);
            break;

        case YAML_SCALAR_EVENT:
            yaml_free(event->data.scalar.anchor);
            yaml_free(event->data.scalar.tag);
            yaml_free(event->data.scalar.value);
            break;

        case YAML_SEQUENCE_START_EVENT:
            yaml_free(event->data.sequence_start.anchor);
            yaml_free(event->data.sequence_start.tag);
            break;

        case YAML_MAPPING_START_EVENT:
            yaml_free(event->data.mapping_start.anchor);
            yaml_free(event->data.mapping_start.tag);
            break;

        default:
            break;
    }

    memset(event, 0, sizeof(yaml_event_t));
}